

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

qsizetype QtPrivate::indexOf<QModelIndex,QModelIndex>
                    (QList<QModelIndex> *vector,QModelIndex *u,qsizetype from)

{
  ulong uVar1;
  QModelIndex *pQVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = (vector->d).size;
  uVar3 = from;
  if (from < 0) {
    uVar3 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar3 = 0;
    }
  }
  if (uVar3 < uVar1) {
    pQVar2 = (vector->d).ptr;
    lVar4 = uVar3 * 0x18;
    do {
      if ((((*(int *)((long)&pQVar2->r + lVar4) == u->r) &&
           (*(int *)((long)&pQVar2->c + lVar4) == u->c)) &&
          (*(quintptr *)((long)&pQVar2->i + lVar4) == u->i)) &&
         (*(QAbstractItemModel **)((long)&(pQVar2->m).ptr + lVar4) == (u->m).ptr)) {
        return (lVar4 >> 3) * -0x5555555555555555;
      }
      lVar4 = lVar4 + 0x18;
    } while (uVar1 * 0x18 != lVar4);
  }
  return -1;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }